

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  void *pvVar1;
  bool bVar2;
  mz_bool mVar3;
  tinfl_status tVar4;
  size_t sVar5;
  mz_uint8 *pOut_buf_start;
  size_t sVar6;
  size_t sVar7;
  mz_ulong mVar8;
  mz_uint8 *ptr;
  long lVar9;
  ulong uVar10;
  mz_uint8 *pOut_buf_next;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong local_2df8;
  mz_uint64 local_2df0;
  ulong local_2dd0;
  size_t out_buf_size;
  size_t in_buf_size;
  size_t local_2db8;
  ulong local_2db0;
  long local_2da8;
  size_t local_2da0;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  
  mVar3 = mz_zip_reader_file_stat(pZip,file_index,&file_stat);
  if (mVar3 == 0) {
    return 0;
  }
  if (file_stat.m_comp_size == 0) {
    return 1;
  }
  mVar3 = mz_zip_reader_is_file_a_directory(pZip,file_index);
  if (mVar3 != 0) {
    return 1;
  }
  if (((byte)file_stat.m_bit_flag & 0x21) != 0) {
    return 0;
  }
  if (((flags >> 10 & 1) == 0) && ((file_stat.m_method & 0xfff7) != 0)) {
    return 0;
  }
  sVar5 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_local_header_ofs,local_header_u32,0x1e);
  if (sVar5 != 0x1e) {
    return 0;
  }
  if (local_header_u32[0] != 0x4034b50) {
    return 0;
  }
  if (pZip->m_archive_size <
      file_stat.m_local_header_ofs + local_header_u32[6]._2_2_ + (ulong)(ushort)local_header_u32[7]
      + file_stat.m_comp_size + 0x1e) {
    return 0;
  }
  local_2df0 = (ulong)(ushort)local_header_u32[7] +
               file_stat.m_local_header_ofs + local_header_u32[6]._2_2_ + 0x1e;
  pvVar1 = pZip->m_pState->m_pMem;
  if (pvVar1 == (void *)0x0) {
    local_2dd0 = 0x10000;
    if (file_stat.m_comp_size < 0x10000) {
      local_2dd0 = file_stat.m_comp_size;
    }
    ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2dd0);
    if (ptr == (mz_uint8 *)0x0) {
      return 0;
    }
    uVar13 = 0;
    uVar11 = file_stat.m_comp_size;
  }
  else {
    ptr = (mz_uint8 *)((long)pvVar1 + local_2df0);
    local_2dd0 = file_stat.m_comp_size;
    uVar11 = 0;
    uVar13 = file_stat.m_comp_size;
  }
  if (((flags >> 10 & 1) == 0) && (file_stat.m_method != 0)) {
    inflator.m_state = 0;
    pOut_buf_start = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
    if (pOut_buf_start == (mz_uint8 *)0x0) {
LAB_0012df3a:
      pOut_buf_start = (mz_uint8 *)0x0;
      uVar12 = 0;
      goto LAB_0012df78;
    }
    local_2df8 = 0;
    lVar9 = 0;
    sVar5 = 0;
    do {
      uVar10 = (ulong)((uint)sVar5 & 0x7fff);
      out_buf_size = 0x8000 - uVar10;
      if (uVar13 == 0) {
        if (pZip->m_pState->m_pMem == (void *)0x0) {
          uVar13 = uVar11;
          if (local_2dd0 < uVar11) {
            uVar13 = local_2dd0;
          }
          sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2df0,ptr,uVar13);
          if (sVar6 != uVar13) goto LAB_0012de38;
          local_2df0 = local_2df0 + uVar13;
          uVar11 = uVar11 - uVar13;
          lVar9 = 0;
        }
        else {
          uVar13 = 0;
        }
      }
      pOut_buf_next = pOut_buf_start + uVar10;
      in_buf_size = uVar13;
      local_2da8 = lVar9;
      local_2da0 = uVar13;
      tVar4 = tinfl_decompress(&inflator,ptr + lVar9,&in_buf_size,pOut_buf_start,pOut_buf_next,
                               &out_buf_size,(uint)(uVar11 != 0) * 2);
      sVar6 = out_buf_size;
      if (out_buf_size == 0) {
        bVar2 = true;
        sVar6 = in_buf_size;
      }
      else {
        local_2db8 = in_buf_size;
        local_2db0 = (ulong)(uint)tVar4;
        sVar7 = (*pCallback)(pOpaque,sVar5,pOut_buf_next,out_buf_size);
        if (sVar7 != sVar6) goto LAB_0012de38;
        local_2df8 = mz_crc32(local_2df8 & 0xffffffff,pOut_buf_next,sVar6);
        sVar5 = sVar5 + sVar6;
        bVar2 = sVar5 <= file_stat.m_uncomp_size;
        sVar6 = local_2db8;
        tVar4 = (tinfl_status)local_2db0;
        if (file_stat.m_uncomp_size < sVar5) {
          tVar4 = TINFL_STATUS_FAILED;
        }
      }
      if (!bVar2) break;
      uVar13 = local_2da0 - sVar6;
      lVar9 = local_2da8 + sVar6;
    } while ((uint)(tVar4 + TINFL_STATUS_FAILED) < 2);
    if (tVar4 != TINFL_STATUS_DONE) {
LAB_0012de38:
      uVar12 = 0;
      goto LAB_0012df78;
    }
LAB_0012df51:
    uVar12 = 1;
    if ((flags >> 10 & 1) != 0) goto LAB_0012df78;
  }
  else {
    if (pZip->m_pState->m_pMem == (void *)0x0) {
      local_2df8 = 0;
      sVar5 = 0;
      for (; uVar11 != 0; uVar11 = uVar11 - uVar13) {
        uVar13 = uVar11;
        if (local_2dd0 < uVar11) {
          uVar13 = local_2dd0;
        }
        sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2df0,ptr,uVar13);
        if (sVar6 != uVar13) goto LAB_0012df3a;
        if ((flags >> 10 & 1) == 0) {
          local_2df8 = mz_crc32(local_2df8 & 0xffffffff,ptr,uVar13);
        }
        sVar6 = (*pCallback)(pOpaque,sVar5,ptr,uVar13);
        if (sVar6 != uVar13) goto LAB_0012df3a;
        local_2df0 = local_2df0 + uVar13;
        sVar5 = sVar5 + uVar13;
      }
      pOut_buf_start = (mz_uint8 *)0x0;
      goto LAB_0012df51;
    }
    sVar5 = (*pCallback)(pOpaque,0,ptr,file_stat.m_comp_size);
    uVar12 = (uint)(sVar5 == file_stat.m_comp_size);
    if ((flags >> 10 & 1) != 0) {
      pOut_buf_start = (mz_uint8 *)0x0;
      goto LAB_0012df78;
    }
    pOut_buf_start = (mz_uint8 *)0x0;
    if (sVar5 != file_stat.m_comp_size) goto LAB_0012df78;
    pOut_buf_start = (mz_uint8 *)0x0;
    mVar8 = mz_crc32(0,ptr,sVar5);
    local_2df8._0_4_ = (mz_uint32)mVar8;
  }
  uVar12 = (uint)((mz_uint32)local_2df8 == file_stat.m_crc32 && sVar5 == file_stat.m_uncomp_size);
LAB_0012df78:
  if (pZip->m_pState->m_pMem == (void *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
  }
  if (pOut_buf_start != (mz_uint8 *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pOut_buf_start);
    return uVar12;
  }
  return uVar12;
}

Assistant:

mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive *pZip, mz_uint file_index, mz_file_write_func pCallback, void *pOpaque, mz_uint flags)
{
  int status = TINFL_STATUS_DONE; mz_uint file_crc32 = MZ_CRC32_INIT;
  mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining, out_buf_ofs = 0, cur_file_ofs;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf = NULL; void *pWrite_buf = NULL;
  mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)]; mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  // Empty file, or a directory (but not always a directory - I've seen odd zips with directories that have compressed data which inflates to 0 bytes)
  if (!file_stat.m_comp_size)
    return MZ_TRUE;

  // Entry is a subdirectory (I've seen old zips with dir entries which have compressed deflate data which inflates to 0 bytes, but these entries claim to uncompress to 512 bytes in the headers).
  // I'm torn how to handle this case - should it fail instead?
  if (mz_zip_reader_is_file_a_directory(pZip, file_index))
    return MZ_TRUE;

  // Encryption and patch files are not supported.
  if (file_stat.m_bit_flag & (1 | 32))
    return MZ_FALSE;

  // This function only supports stored and deflate.
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
    return MZ_FALSE;

  // Read and parse the local directory entry.
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;

  cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return MZ_FALSE;

  // Decompress the file either directly from memory or from a file input buffer.
  if (pZip->m_pState->m_pMem)
  {
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  }
  else
  {
    read_buf_size = MZ_MIN(file_stat.m_comp_size, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)read_buf_size)))
      return MZ_FALSE;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method))
  {
    // The file is stored or the caller has requested the compressed data.
    if (pZip->m_pState->m_pMem)
    {
#ifdef _MSC_VER
      if (((0, sizeof(size_t) == sizeof(mz_uint32))) && (file_stat.m_comp_size > 0xFFFFFFFF))
#else
      if (((sizeof(size_t) == sizeof(mz_uint32))) && (file_stat.m_comp_size > 0xFFFFFFFF))
#endif
        return MZ_FALSE;
      if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)file_stat.m_comp_size) != file_stat.m_comp_size)
        status = TINFL_STATUS_FAILED;
      else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
        file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf, (size_t)file_stat.m_comp_size);
      cur_file_ofs += file_stat.m_comp_size;
      out_buf_ofs += file_stat.m_comp_size;
      comp_remaining = 0;
    }
    else
    {
      while (comp_remaining)
      {
        read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
        {
          status = TINFL_STATUS_FAILED;
          break;
        }

        if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
          file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf, (size_t)read_buf_avail);

        if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
        {
          status = TINFL_STATUS_FAILED;
          break;
        }
        cur_file_ofs += read_buf_avail;
        out_buf_ofs += read_buf_avail;
        comp_remaining -= read_buf_avail;
      }
    }
  }
  else
  {
    tinfl_decompressor inflator;
    tinfl_init(&inflator);

    if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, TINFL_LZ_DICT_SIZE)))
      status = TINFL_STATUS_FAILED;
    else
    {
      do
      {
        mz_uint8 *pWrite_buf_cur = (mz_uint8 *)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        size_t in_buf_size, out_buf_size = TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        if ((!read_buf_avail) && (!pZip->m_pState->m_pMem))
        {
          read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
          if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
          {
            status = TINFL_STATUS_FAILED;
            break;
          }
          cur_file_ofs += read_buf_avail;
          comp_remaining -= read_buf_avail;
          read_buf_ofs = 0;
        }

        in_buf_size = (size_t)read_buf_avail;
        status = tinfl_decompress(&inflator, (const mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size, (mz_uint8 *)pWrite_buf, pWrite_buf_cur, &out_buf_size, comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
        read_buf_avail -= in_buf_size;
        read_buf_ofs += in_buf_size;

        if (out_buf_size)
        {
          if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) != out_buf_size)
          {
            status = TINFL_STATUS_FAILED;
            break;
          }
          file_crc32 = (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
          if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size)
          {
            status = TINFL_STATUS_FAILED;
            break;
          }
        }
      } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) || (status == TINFL_STATUS_HAS_MORE_OUTPUT));
    }
  }

  if ((status == TINFL_STATUS_DONE) && (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
  {
    // Make sure the entire file was decompressed, and check its CRC.
    if ((out_buf_ofs != file_stat.m_uncomp_size) || (file_crc32 != file_stat.m_crc32))
      status = TINFL_STATUS_FAILED;
  }

  if (!pZip->m_pState->m_pMem)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  if (pWrite_buf)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

  return status == TINFL_STATUS_DONE;
}